

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

int DnsStats::GetDnsName
              (uint8_t *packet,uint32_t length,uint32_t start,uint8_t *name,size_t name_max,
              size_t *name_length)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint length_00;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t flags;
  uint32_t local_34;
  
  if (name_max == 0 || length <= start) {
    length = 0;
LAB_0018c9a0:
    uVar3 = 0;
    uVar7 = length;
  }
  else {
    uVar3 = 0;
    uVar6 = start;
    uVar5 = 0;
    while( true ) {
      bVar1 = packet[uVar6];
      length_00 = (uint)bVar1;
      if (bVar1 == 0) break;
      if ((~length_00 & 0xc0) == 0) {
        uVar4 = uVar6 + 2;
        uVar7 = length;
        if (length < uVar4) goto LAB_0018c9a2;
        uVar6 = (uint)packet[(ulong)uVar6 + 1] | (length_00 & 0x3f) << 8;
        if (start <= uVar6) goto LAB_0018c9a0;
        uVar7 = uVar4;
        if (uVar5 != 0) {
          uVar7 = uVar5;
        }
      }
      else {
        if (((0x3f < bVar1) || (uVar7 = uVar6 + length_00 + 1, length < uVar7)) ||
           (name_max < length_00 + uVar3 + 2)) goto LAB_0018c9a0;
        if (uVar3 == 0) {
          uVar3 = 0;
        }
        else if (uVar3 + 1 < name_max) {
          name[uVar3] = '.';
          uVar3 = uVar3 + 1;
        }
        sVar2 = NormalizeNamePart(length_00,packet + (uVar6 + 1),name + uVar3,name_max - uVar3,
                                  &local_34);
        uVar3 = sVar2 + uVar3;
        uVar6 = uVar7;
        uVar7 = uVar5;
      }
      if ((length <= uVar6) || (uVar5 = uVar7, name_max <= uVar3)) goto LAB_0018c9a2;
    }
    uVar7 = uVar6 + 1;
    if (uVar5 != 0) {
      uVar7 = uVar5;
    }
  }
LAB_0018c9a2:
  name[uVar3] = '\0';
  *name_length = uVar3;
  return uVar7;
}

Assistant:

int DnsStats::GetDnsName(uint8_t * packet, uint32_t length, uint32_t start,
    uint8_t * name, size_t name_max, size_t * name_length)
{
    uint32_t l = 0;
    uint32_t name_start = start;
    uint32_t start_next = 0;
    size_t name_index = 0;

    while (start <length && name_index < name_max) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            start++;

            if (start_next == 0) {
                start_next = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                start_next = length;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];

                if (new_start < name_start)
                {
                    if (start_next == 0) {
                        start_next = start + 2;
                    }
                    start = new_start;
                } else {
                    /* Basic restriction to avoid name decoding loops */
                    name_index = 0;
                    start_next = length;
                    break;
                }
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            name_index = 0;
            start_next = length;
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length ||
                name_index + l + 2 > name_max)
            {
                /* format error */
                name_index = 0;
                start_next = length;
                break;
            }
            else
            {
                uint32_t flags;
                if (name_index > 0 && name_index+1 < name_max) {
                    name[name_index++] = '.';
                }

                name_index += NormalizeNamePart(l, &packet[start + 1], name + name_index, name_max - name_index, &flags);

                start += l + 1; 
            }
        }
    }

    name[name_index] = 0;

    *name_length = name_index;

    return start_next;
}